

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Gia_ManComputeEdgeDelay2(Gia_Man_t *p)

{
  uint uVar1;
  bool bVar2;
  Vec_Int_t *vFanMax1;
  int *__s;
  Vec_Int_t *vFanMax2;
  int *__s_00;
  Vec_Int_t *vCountMax;
  int *__s_01;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = p->nObjs;
  vFanMax1 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar5 = iVar9;
  }
  vFanMax1->nSize = 0;
  vFanMax1->nCap = iVar5;
  lVar10 = (long)iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc(lVar10 * 4);
  }
  lVar8 = (long)iVar9;
  vFanMax1->pArray = __s;
  vFanMax1->nSize = iVar9;
  if (__s != (int *)0x0) {
    memset(__s,0,lVar8 * 4);
  }
  vFanMax2 = (Vec_Int_t *)malloc(0x10);
  vFanMax2->nSize = 0;
  vFanMax2->nCap = iVar5;
  if (iVar5 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc(lVar10 * 4);
  }
  vFanMax2->pArray = __s_00;
  vFanMax2->nSize = iVar9;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0,lVar8 * 4);
  }
  vCountMax = (Vec_Int_t *)malloc(0x10);
  vCountMax->nSize = 0;
  vCountMax->nCap = iVar5;
  if (iVar5 == 0) {
    __s_01 = (int *)0x0;
  }
  else {
    __s_01 = (int *)malloc(lVar10 << 2);
  }
  vCountMax->pArray = __s_01;
  vCountMax->nSize = iVar9;
  if (__s_01 != (int *)0x0) {
    memset(__s_01,0,lVar8 << 2);
  }
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x23e,"int Gia_ManComputeEdgeDelay2(Gia_Man_t *)");
  }
  if (p->vEdgeDelay != (Vec_Int_t *)0x0) {
    piVar4 = p->vEdgeDelay->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vEdgeDelay->pArray = (int *)0x0;
    }
    if (p->vEdgeDelay != (Vec_Int_t *)0x0) {
      free(p->vEdgeDelay);
      p->vEdgeDelay = (Vec_Int_t *)0x0;
    }
  }
  if (p->vEdge1 != (Vec_Int_t *)0x0) {
    piVar4 = p->vEdge1->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vEdge1->pArray = (int *)0x0;
    }
    if (p->vEdge1 != (Vec_Int_t *)0x0) {
      free(p->vEdge1);
      p->vEdge1 = (Vec_Int_t *)0x0;
    }
  }
  if (p->vEdge2 != (Vec_Int_t *)0x0) {
    piVar4 = p->vEdge2->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vEdge2->pArray = (int *)0x0;
    }
    if (p->vEdge2 != (Vec_Int_t *)0x0) {
      free(p->vEdge2);
      p->vEdge2 = (Vec_Int_t *)0x0;
    }
  }
  uVar1 = p->nObjs;
  uVar7 = (ulong)uVar1;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar6 = uVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar6;
  lVar10 = (long)(int)uVar6;
  if (uVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar10 * 4);
  }
  lVar8 = (long)(int)uVar1;
  pVVar3->pArray = piVar4;
  pVVar3->nSize = uVar1;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,lVar8 * 4);
  }
  p->vEdgeDelay = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar6;
  if (uVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar10 * 4);
  }
  pVVar3->pArray = piVar4;
  pVVar3->nSize = uVar1;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,lVar8 * 4);
  }
  p->vEdge1 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar6;
  if (uVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar10 << 2);
  }
  pVVar3->pArray = piVar4;
  pVVar3->nSize = uVar1;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,lVar8 << 2);
  }
  p->vEdge2 = pVVar3;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    if (p->vMapping2 == (Vec_Wec_t *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x24d,"int Gia_ManComputeEdgeDelay2(Gia_Man_t *)");
    }
    if (1 < (int)uVar1) {
      lVar10 = uVar7 * 0x10 + -0xc;
      do {
        if ((long)p->vMapping2->nSize < (long)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if (*(int *)((long)&p->vMapping2->pArray->nCap + lVar10) != 0) {
          Gia_ObjComputeEdgeDelay2
                    (p,(int)uVar7 + -1,p->vEdgeDelay,p->vEdge1,p->vEdge2,vFanMax1,vFanMax2,vCountMax
                    );
        }
        lVar10 = lVar10 + -0x10;
        bVar2 = 2 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar2);
    }
  }
  else if (1 < (int)uVar1) {
    do {
      if ((long)p->vMapping->nSize < (long)uVar7) goto LAB_001f9432;
      if (p->vMapping->pArray[uVar7 - 1] != 0) {
        Gia_ObjComputeEdgeDelay2
                  (p,(int)uVar7 + -1,p->vEdgeDelay,p->vEdge1,p->vEdge2,vFanMax1,vFanMax2,vCountMax);
      }
      bVar2 = 2 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
  }
  lVar10 = (long)p->vCis->nSize;
  if (lVar10 < 1) {
    iVar9 = 0;
  }
  else {
    lVar8 = 0;
    iVar9 = 0;
    do {
      iVar5 = p->vCis->pArray[lVar8];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar5 == 0) break;
      if (p->vEdgeDelay->nSize <= iVar5) {
LAB_001f9432:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vEdgeDelay->pArray[iVar5];
      if (iVar9 <= iVar5) {
        iVar9 = iVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar10 != lVar8);
  }
  if (__s != (int *)0x0) {
    free(__s);
    vFanMax1->pArray = (int *)0x0;
  }
  free(vFanMax1);
  if (__s_00 != (int *)0x0) {
    free(__s_00);
    vFanMax2->pArray = (int *)0x0;
  }
  free(vFanMax2);
  if (__s_01 != (int *)0x0) {
    free(__s_01);
    vCountMax->pArray = (int *)0x0;
  }
  free(vCountMax);
  return iVar9;
}

Assistant:

int Gia_ManComputeEdgeDelay2( Gia_Man_t * p )
{
    int k, iLut, DelayMax = 0;
    Vec_Int_t * vFanMax1 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vFanMax2 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vCountMax = Vec_IntStart( Gia_ManObjNum(p) );
    assert( p->pManTime == NULL );
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
//    Gia_ManForEachCoDriverId( p, iLut, k )
//        Vec_IntWriteEntry( p->vEdgeDelay, iLut, 1 );
    if ( Gia_ManHasMapping(p) )
        Gia_ManForEachLutReverse( p, iLut )
            Gia_ObjComputeEdgeDelay2( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, vFanMax1, vFanMax2, vCountMax );
    else if ( Gia_ManHasMapping2(p) )
        Gia_ManForEachLut2Reverse( p, iLut )
            Gia_ObjComputeEdgeDelay2( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, vFanMax1, vFanMax2, vCountMax );
    else assert( 0 );
    Gia_ManForEachCiId( p, iLut, k )
        DelayMax = Abc_MaxInt( DelayMax, Vec_IntEntry(p->vEdgeDelay, iLut) );
    Vec_IntFree( vFanMax1 );
    Vec_IntFree( vFanMax2 );
    Vec_IntFree( vCountMax );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(p), DelayMax );
    return DelayMax;
}